

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scomplex.c
# Opt level: O2

void c_div(singlecomplex *c,singlecomplex *a,singlecomplex *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar6;
  singlecomplex sVar4;
  undefined1 auVar5 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  
  sVar4 = *b;
  auVar9._8_8_ = 0;
  auVar9._0_4_ = sVar4.r;
  auVar9._4_4_ = sVar4.i;
  fVar11 = sVar4.r;
  fVar7 = sVar4.i;
  auVar8._0_8_ = (ulong)sVar4 ^ 0x8000000080000000;
  auVar8._8_4_ = 0x80000000;
  auVar8._12_4_ = 0x80000000;
  auVar9 = maxps(auVar8,auVar9);
  if (auVar9._0_4_ <= auVar9._4_4_) {
    if ((fVar7 == 0.0) && (!NAN(fVar7))) {
      fwrite("z_div.c: division by zero\n",0x1a,1,_stderr);
      exit(-1);
    }
    fVar11 = fVar11 / fVar7;
    fVar7 = (fVar11 * fVar11 + 1.0) * fVar7;
    fVar3 = (*a).r;
    fVar6 = (*a).i;
    auVar5._0_4_ = fVar11 * fVar3 + fVar6;
    auVar5._4_4_ = fVar11 * fVar6 + -fVar3;
    auVar5._8_4_ = fVar11 * 0.0 + fVar6;
    auVar5._12_4_ = fVar11 * 0.0 + fVar6;
    auVar2._4_4_ = fVar7;
    auVar2._0_4_ = fVar7;
    auVar2._8_4_ = fVar7;
    auVar2._12_4_ = fVar7;
    auVar9 = divps(auVar5,auVar2);
    sVar4 = auVar9._0_8_;
  }
  else {
    fVar7 = fVar7 / fVar11;
    fVar11 = (fVar7 * fVar7 + 1.0) * fVar11;
    fVar3 = (*a).r;
    fVar6 = (*a).i;
    auVar10._0_4_ = fVar7 * fVar6 + fVar3;
    auVar10._4_4_ = fVar7 * -fVar3 + fVar6;
    auVar10._8_4_ = fVar7 * fVar6 + 0.0;
    auVar10._12_4_ = fVar7 * fVar6 + 0.0;
    auVar1._4_4_ = fVar11;
    auVar1._0_4_ = fVar11;
    auVar1._8_4_ = fVar11;
    auVar1._12_4_ = fVar11;
    auVar9 = divps(auVar10,auVar1);
    sVar4 = auVar9._0_8_;
  }
  *c = sVar4;
  return;
}

Assistant:

void c_div(singlecomplex *c, const singlecomplex *a, const singlecomplex *b)
{
    float ratio, den;
    float abr, abi, cr, ci;
  
    if( (abr = b->r) < 0.)
	abr = - abr;
    if( (abi = b->i) < 0.)
	abi = - abi;
    if( abr <= abi ) {
	if (abi == 0) {
	    fprintf(stderr, "z_div.c: division by zero\n");
            exit(-1);
	}	  
	ratio = b->r / b->i ;
	den = b->i * (1 + ratio*ratio);
	cr = (a->r*ratio + a->i) / den;
	ci = (a->i*ratio - a->r) / den;
    } else {
	ratio = b->i / b->r ;
	den = b->r * (1 + ratio*ratio);
	cr = (a->r + a->i*ratio) / den;
	ci = (a->i - a->r*ratio) / den;
    }
    c->r = cr;
    c->i = ci;
}